

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O1

Spectrum * __thiscall
phyr::BSDF::rho(Spectrum *__return_storage_ptr__,BSDF *this,int nSamples,Point2f *samples1,
               Point2f *samples2,BxDFType flags)

{
  double *pdVar1;
  double *pdVar2;
  BxDF *pBVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  double local_210 [60];
  
  memset(__return_storage_ptr__,0,0x1e0);
  if (0 < this->nBxDFs) {
    lVar7 = 0;
    do {
      pBVar3 = this->bxdfs[lVar7];
      if ((pBVar3->type & ~flags) == 0) {
        (*pBVar3->_vptr_BxDF[5])(local_210,pBVar3,(ulong)(uint)nSamples,samples1,samples2);
        lVar6 = 0;
        do {
          dVar4 = local_210[lVar6 + 1];
          pdVar1 = (__return_storage_ptr__->super_CoefficientSpectrum<60>).samples + lVar6;
          dVar5 = pdVar1[1];
          pdVar2 = (__return_storage_ptr__->super_CoefficientSpectrum<60>).samples + lVar6;
          *pdVar2 = *pdVar1 + local_210[lVar6];
          pdVar2[1] = dVar5 + dVar4;
          lVar6 = lVar6 + 2;
        } while (lVar6 != 0x3c);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < this->nBxDFs);
  }
  return __return_storage_ptr__;
}

Assistant:

Spectrum BSDF::rho(int nSamples, const Point2f* samples1,
                   const Point2f* samples2, BxDFType flags) const {
    Spectrum ret(0.f);
    for (int i = 0; i < nBxDFs; ++i)
        if (bxdfs[i]->matchesFlags(flags))
            ret += bxdfs[i]->rho(nSamples, samples1, samples2);
    return ret;
}